

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

char * mpt_encoding_type(int type)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if ((uint)(byte)_encodings[0].name[lVar1 + 0x1f] == type) {
      return _encodings[0].name + lVar1;
    }
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x100);
  return (char *)0x0;
}

Assistant:

extern const char *mpt_encoding_type(int type)
{
	static const int max = sizeof(_encodings)/sizeof(*_encodings);
	int i;
	
	for (i = 0; i < max; ++i) {
		if (((int) _encodings[i].id) == type) {
			return _encodings[i].name;
		}
	}
	return 0;
}